

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# block.cc
# Opt level: O3

void __thiscall leveldb::Block::Iter::CorruptionError(Iter *this)

{
  char *pcVar1;
  Status local_40;
  Slice local_38;
  Slice local_28;
  
  this->current_ = this->restarts_;
  this->restart_index_ = this->num_restarts_;
  local_28.data_ = "bad entry in block";
  local_28.size_ = 0x12;
  local_38.data_ = "";
  local_38.size_ = 0;
  Status::Status(&local_40,kCorruption,&local_28,&local_38);
  pcVar1 = (this->status_).state_;
  (this->status_).state_ = local_40.state_;
  if (pcVar1 != (char *)0x0) {
    local_40.state_ = pcVar1;
    operator_delete__(pcVar1);
  }
  (this->key_)._M_string_length = 0;
  *(this->key_)._M_dataplus._M_p = '\0';
  (this->value_).data_ = "";
  (this->value_).size_ = 0;
  return;
}

Assistant:

void CorruptionError() {
    current_ = restarts_;
    restart_index_ = num_restarts_;
    status_ = Status::Corruption("bad entry in block");
    key_.clear();
    value_.clear();
  }